

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O0

Gia_Man_t * Unr_ManUnrollSimple(Gia_Man_t *pGia,int nFrames)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_38;
  int local_34;
  int i;
  int f;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Gia_Man_t *pFrames;
  int nFrames_local;
  Gia_Man_t *pGia_local;
  
  p = Gia_ManStart(10000);
  pcVar3 = Abc_UtilStrsav(pGia->pName);
  p->pName = pcVar3;
  Gia_ManHashAlloc(p);
  pGVar4 = Gia_ManConst0(pGia);
  pGVar4->Value = 0;
  local_38 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(pGia);
    bVar6 = false;
    if (local_38 < iVar1) {
      iVar1 = Gia_ManPoNum(pGia);
      pObjRi = Gia_ManCo(pGia,iVar1 + local_38);
      bVar6 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pObjRi->Value = 0;
    local_38 = local_38 + 1;
  }
  for (local_34 = 0; local_34 < nFrames; local_34 = local_34 + 1) {
    local_38 = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(pGia);
      bVar6 = false;
      if (local_38 < iVar1) {
        pObjRi = Gia_ManCi(pGia,local_38);
        bVar6 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      uVar2 = Gia_ManAppendCi(p);
      pObjRi->Value = uVar2;
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(pGia);
      bVar6 = false;
      if (local_38 < iVar1) {
        iVar1 = Gia_ManPoNum(pGia);
        _i = Gia_ManCo(pGia,iVar1 + local_38);
        bVar6 = false;
        if (_i != (Gia_Obj_t *)0x0) {
          iVar1 = Gia_ManPiNum(pGia);
          pObjRi = Gia_ManCi(pGia,iVar1 + local_38);
          bVar6 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar6) break;
      pObjRi->Value = _i->Value;
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      bVar6 = false;
      if (local_38 < pGia->nObjs) {
        pObjRi = Gia_ManObj(pGia,local_38);
        bVar6 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjIsAnd(pObjRi);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(pObjRi);
        iLit1 = Gia_ObjFanin1Copy(pObjRi);
        uVar2 = Gia_ManHashAnd(p,iVar1,iLit1);
        pObjRi->Value = uVar2;
      }
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(pGia->vCos);
      bVar6 = false;
      if (local_38 < iVar1) {
        pObjRi = Gia_ManCo(pGia,local_38);
        bVar6 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      uVar2 = Gia_ObjFanin0Copy(pObjRi);
      pObjRi->Value = uVar2;
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(pGia);
      bVar6 = false;
      if (local_38 < iVar1) {
        pObjRi = Gia_ManCo(pGia,local_38);
        bVar6 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      Gia_ManAppendCo(p,pObjRi->Value);
      local_38 = local_38 + 1;
    }
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar5 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar5;
}

Assistant:

Gia_Man_t * Unr_ManUnrollSimple( Gia_Man_t * pGia, int nFrames )
{
    Gia_Man_t * pFrames;
    Gia_Obj_t * pObj, * pObjRi;
    int f, i; 
    pFrames = Gia_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashAlloc( pFrames );
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachRi( pGia, pObj, i )
        pObj->Value = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( pGia, pObj, i )
            pObj->Value = Gia_ManAppendCi(pFrames);
        Gia_ManForEachRiRo( pGia, pObjRi, pObj, i )
            pObj->Value = pObjRi->Value;
        Gia_ManForEachAnd( pGia, pObj, i )
            pObj->Value = Gia_ManHashAnd( pFrames, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( pGia, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachPo( pGia, pObj, i )
            Gia_ManAppendCo( pFrames, pObj->Value );
    }
    Gia_ManHashStop( pFrames );
    Gia_ManSetRegNum( pFrames, 0 );
    pFrames = Gia_ManCleanup( pGia = pFrames );
    Gia_ManStop( pGia );
    return pFrames;
}